

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

void m256v_swap_cols(m256v *M,int c1,int c2)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if (c1 != c2) {
    lVar3 = (long)c1;
    lVar4 = (long)c2;
    for (iVar5 = 0; iVar5 < M->n_row; iVar5 = iVar5 + 1) {
      puVar2 = M->e;
      uVar1 = puVar2[lVar3];
      puVar2[lVar3] = puVar2[lVar4];
      M->e[lVar4] = uVar1;
      lVar3 = lVar3 + M->rstride;
      lVar4 = lVar4 + M->rstride;
    }
  }
  return;
}

Assistant:

void m256v_swap_cols(m256v* M, int c1, int c2)
{
	if (c1 == c2)
		return;

	size_t o1 = get_el_offs(M, 0, c1);
	size_t o2 = get_el_offs(M, 0, c2);
	for (int i = 0; i < M->n_row; ++i) {
		const uint8_t sw = M->e[o1];
		M->e[o1] = M->e[o2];
		M->e[o2] = sw;
		o1 += M->rstride;
		o2 += M->rstride;
	}
}